

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

char __thiscall duckdb::Linenoise::Search(Linenoise *this,char c)

{
  pointer psVar1;
  int iVar2;
  EscapeSequence EVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char cVar7;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  switch(iVar2) {
  case 1:
switchD_00214f35_caseD_1:
    AcceptSearch(this,'\x01');
    return '\x01';
  case 2:
switchD_00214f35_caseD_2:
    AcceptSearch(this,'\x02');
    return '\x02';
  case 3:
  case 7:
    CancelSearch(this);
    return '\0';
  case 4:
    AcceptSearch(this,'\x04');
    cVar7 = '\x04';
    break;
  case 5:
  case 9:
switchD_00214f35_caseD_5:
    AcceptSearch(this,'\x05');
    cVar7 = '\x05';
    break;
  case 6:
switchD_00214f35_caseD_6:
    AcceptSearch(this,'\x06');
    cVar7 = '\x06';
    break;
  case 10:
  case 0xd:
    AcceptSearch(this,'\r');
    cVar7 = '\r';
    break;
  case 0xb:
    AcceptSearch(this,'\v');
    cVar7 = '\v';
    break;
  case 0xc:
    linenoiseClearScreen();
    goto switchD_00215045_caseD_a;
  case 0xe:
  case 0x12:
  case 0x13:
switchD_00214f35_caseD_e:
    psVar1 = (this->search_matches).
             super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = this->search_index + 1;
    this->search_index = uVar5;
    if ((ulong)(((long)psVar1 -
                 (long)(this->search_matches).
                       super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
        uVar5) {
      this->search_index = 0;
    }
    goto switchD_00215045_caseD_a;
  case 0xf:
  case 0x11:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
switchD_00214f35_caseD_f:
    ::std::__cxx11::string::push_back((char)this + 'h');
    goto LAB_00214fe7;
  case 0x10:
switchD_00214f35_caseD_10:
    sVar4 = this->search_index;
    if (sVar4 == 0) {
      lVar6 = (long)(this->search_matches).
                    super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->search_matches).
                    super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar6 == 0) goto switchD_00215045_caseD_a;
      sVar4 = (lVar6 >> 3) * -0x5555555555555555;
    }
    this->search_index = sVar4 - 1;
    goto switchD_00215045_caseD_a;
  case 0x14:
    AcceptSearch(this,'\x14');
    cVar7 = '\x14';
    break;
  case 0x15:
    AcceptSearch(this,'\x15');
    cVar7 = '\x15';
    break;
  case 0x1b:
    EVar3 = Terminal::ReadEscapeSequence(this->ifd);
    switch(EVar3) {
    case HOME:
      goto switchD_00214f35_caseD_1;
    case END:
      goto switchD_00214f35_caseD_5;
    case UP:
      goto switchD_00214f35_caseD_10;
    case DOWN:
      goto switchD_00214f35_caseD_e;
    case RIGHT:
      goto switchD_00214f35_caseD_6;
    case LEFT:
      goto switchD_00214f35_caseD_2;
    default:
      goto switchD_00215045_caseD_a;
    case ESCAPE:
      AcceptSearch(this,'\0');
      return '\0';
    }
  default:
    if (iVar2 != 0x7f) goto switchD_00214f35_caseD_f;
  case 8:
  case 0x17:
    if ((this->search_buf)._M_string_length != 0) {
      ::std::__cxx11::string::pop_back();
    }
LAB_00214fe7:
    PerformSearch(this);
switchD_00215045_caseD_a:
    RefreshSearch(this);
    return '\0';
  }
  return cVar7;
}

Assistant:

char Linenoise::Search(char c) {
	switch (c) {
	case CTRL_J:
	case ENTER: /* enter */
		// accept search and run
		return AcceptSearch(ENTER);
	case CTRL_R:
	case CTRL_S:
		// move to the next match index
		SearchNext();
		break;
	case ESC: /* escape sequence */ {
		auto escape = Terminal::ReadEscapeSequence(ifd);
		switch (escape) {
		case EscapeSequence::ESCAPE:
			// double escape accepts search without any additional command
			return AcceptSearch(0);
		case EscapeSequence::UP:
			SearchPrev();
			break;
		case EscapeSequence::DOWN:
			SearchNext();
			break;
		case EscapeSequence::HOME:
			return AcceptSearch(CTRL_A);
		case EscapeSequence::END:
			return AcceptSearch(CTRL_E);
		case EscapeSequence::LEFT:
			return AcceptSearch(CTRL_B);
		case EscapeSequence::RIGHT:
			return AcceptSearch(CTRL_F);
		default:
			break;
		}
		break;
	}
	case CTRL_A: // accept search, move to start of line
		return AcceptSearch(CTRL_A);
	case '\t':
	case CTRL_E: // accept search - move to end of line
		return AcceptSearch(CTRL_E);
	case CTRL_B: // accept search - move cursor left
		return AcceptSearch(CTRL_B);
	case CTRL_F: // accept search - move cursor right
		return AcceptSearch(CTRL_F);
	case CTRL_T: // accept search: swap character
		return AcceptSearch(CTRL_T);
	case CTRL_U: // accept search, clear buffer
		return AcceptSearch(CTRL_U);
	case CTRL_K: // accept search, clear after cursor
		return AcceptSearch(CTRL_K);
	case CTRL_D: // accept search, delete a character
		return AcceptSearch(CTRL_D);
	case CTRL_L:
		linenoiseClearScreen();
		break;
	case CTRL_P:
		SearchPrev();
		break;
	case CTRL_N:
		SearchNext();
		break;
	case CTRL_C:
	case CTRL_G:
		// abort search
		CancelSearch();
		return 0;
	case BACKSPACE: /* backspace */
	case CTRL_H:    /* ctrl-h */
	case CTRL_W:    /* ctrl-w */
		// remove trailing UTF-8 bytes (if any)
		while (!search_buf.empty() && ((search_buf.back() & 0xc0) == 0x80)) {
			search_buf.pop_back();
		}
		// finally remove the first UTF-8 byte
		if (!search_buf.empty()) {
			search_buf.pop_back();
		}
		PerformSearch();
		break;
	default:
		// add input to search buffer
		search_buf += c;
		// perform the search
		PerformSearch();
		break;
	}
	RefreshSearch();
	return 0;
}